

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O3

void fight_prog_horde_bull(OBJ_DATA *obj,CHAR_DATA *ch)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  bVar2 = is_affected(ch,(int)gsn_rage);
  if ((bVar2) && (ch->fighting != (CHAR_DATA *)0x0)) {
    iVar3 = number_percent();
    iVar4 = get_skill(ch,(int)gsn_rage);
    if (((double)iVar3 <= (double)iVar4 * 0.1) && (ch->hit < (int)ch->max_hit)) {
      send_to_char("The fortitude of the Bull fills you, inspiring you to ignore your pain and fight on.\n\r"
                   ,ch);
      act("$n\'s muscles ripple with fresh vigor as $s eyes harden with new resolve.",ch,(void *)0x0
          ,(void *)0x0,0);
      sVar1 = ch->max_hit;
      iVar3 = ch->hit;
      iVar4 = number_range((int)ch->level,ch->level * 2);
      iVar4 = iVar4 + iVar3;
      if (sVar1 <= iVar4) {
        iVar4 = (int)sVar1;
      }
      ch->hit = iVar4;
    }
  }
  return;
}

Assistant:

void fight_prog_horde_bull(OBJ_DATA *obj, CHAR_DATA *ch)
{
	if (!is_affected(ch, gsn_rage) || !ch->fighting || number_percent() > (.1 * get_skill(ch, gsn_rage)))
		return;

	if (ch->hit >= ch->max_hit)
		return;

	send_to_char("The fortitude of the Bull fills you, inspiring you to ignore your pain and fight on.\n\r", ch);
	act("$n's muscles ripple with fresh vigor as $s eyes harden with new resolve.", ch, 0, 0, TO_ROOM);

	ch->hit = std::min((int)ch->max_hit, ch->hit + number_range(ch->level * (short)1.2, ch->level * (short)2.2));
}